

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O1

void ScaleRowDown38_C(uint8_t *src_ptr,ptrdiff_t src_stride,uint8_t *dst,int dst_width)

{
  long lVar1;
  
  if (0 < dst_width) {
    lVar1 = 0;
    do {
      dst[lVar1] = *src_ptr;
      dst[lVar1 + 1] = src_ptr[3];
      dst[lVar1 + 2] = src_ptr[6];
      src_ptr = src_ptr + 8;
      lVar1 = lVar1 + 3;
    } while ((int)lVar1 < dst_width);
  }
  return;
}

Assistant:

void ScaleRowDown38_C(const uint8_t* src_ptr,
                      ptrdiff_t src_stride,
                      uint8_t* dst,
                      int dst_width) {
  int x;
  (void)src_stride;
  assert(dst_width % 3 == 0);
  for (x = 0; x < dst_width; x += 3) {
    dst[0] = src_ptr[0];
    dst[1] = src_ptr[3];
    dst[2] = src_ptr[6];
    dst += 3;
    src_ptr += 8;
  }
}